

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

iterator * __thiscall
QPDFNameTreeObjectHelper::find
          (iterator *__return_storage_ptr__,QPDFNameTreeObjectHelper *this,string *key,
          bool return_prev_if_not_found)

{
  __shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined1 local_b8 [48];
  undefined1 local_88 [8];
  iterator i;
  bool return_prev_if_not_found_local;
  string *key_local;
  QPDFNameTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = return_prev_if_not_found;
  this_00 = (__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            __shared_ptr_access<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m);
  this_01 = std::__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_00);
  QPDFObjectHandle::newUnicodeString((QPDFObjectHandle *)(local_b8 + 0x20),key);
  NNTreeImpl::find((iterator *)local_88,this_01,(QPDFObjectHandle *)(local_b8 + 0x20),
                   (bool)(i.ivalue.second.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi._7_1_ & 1));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_b8 + 0x20));
  std::make_shared<NNTreeIterator,NNTreeIterator&>((NNTreeIterator *)local_b8);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)local_b8);
  std::shared_ptr<NNTreeIterator>::~shared_ptr((shared_ptr<NNTreeIterator> *)local_b8);
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_88);
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper::iterator
QPDFNameTreeObjectHelper::find(std::string const& key, bool return_prev_if_not_found)
{
    auto i = m->impl->find(QPDFObjectHandle::newUnicodeString(key), return_prev_if_not_found);
    return {std::make_shared<NNTreeIterator>(i)};
}